

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_num2str(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  string error;
  string cont;
  string hex;
  string oct;
  string flonum;
  operand local_ec [3];
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  psVar1 = label;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  label_to_string_abi_cxx11_(&local_40,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_a0,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_80,psVar1,lab_01);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_e0,psVar1,lab_02);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_e0._M_dataplus._M_p._0_4_ = 5;
    local_ec[0] = R11;
    local_ec[1] = 0x39;
    local_ec[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
    local_e0._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_c0);
    local_e0._M_dataplus._M_p._0_4_ = 0x5a;
    local_ec[0] = RDX;
    local_ec[1] = 0x39;
    local_ec[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
    local_e0._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_c0);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RCX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x34;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_40);
  local_e0._M_dataplus._M_p._0_4_ = 0x4e;
  local_ec[0] = RCX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 5;
  local_ec[0] = RDX;
  local_ec[1] = 0x39;
  local_ec[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_60);
  local_e0._M_dataplus._M_p._0_4_ = 5;
  local_ec[0] = RDX;
  local_ec[1] = 0x39;
  local_ec[2] = 0x20;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_80);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R15;
  local_ec[1] = 0x23;
  local_ec[2] = 200;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_60);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R15;
  local_ec[1] = 0x23;
  local_ec[2] = 0xd0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_80);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R15;
  local_ec[1] = 0x23;
  local_ec[2] = 0xd8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_40);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RCX,R11,&local_c0);
  }
  local_ec[0] = AH;
  local_ec[1] = 0xb;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RCX,R11,&local_c0);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RCX;
  local_ec[1] = 0x1b;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R15;
  local_ec[1] = 0x23;
  local_ec[2] = 0xe0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x4b;
  local_ec[0] = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x4b;
  local_ec[0] = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x41;
  local_ec[0] = XMM0;
  local_ec[1] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RSI;
  local_ec[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RDI;
  local_ec[1] = 0x23;
  local_ec[2] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  save_before_foreign_call(code);
  align_stack(code);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R15;
  local_ec[1] = 0x13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_ec[0] = ST6;
  local_ec[1] = 0x14;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)_skiwi_sprintf_floating;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  local_e0._M_dataplus._M_p._0_4_ = 4;
  local_ec[0] = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R10;
  local_ec[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_e0._M_dataplus._M_p._0_4_ = 0x4a;
  local_ec[0] = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x4a;
  local_ec[0] = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  allocate_buffer_as_string(code);
  local_e0._M_dataplus._M_p._0_4_ = 0x2c;
  local_ec[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x4b;
  local_ec[0] = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x4b;
  local_ec[0] = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RDX;
  local_ec[1] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RSI;
  local_ec[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = RDI;
  local_ec[1] = 0x23;
  local_ec[2] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  save_before_foreign_call(code);
  align_stack(code);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R15;
  local_ec[1] = 0x13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x5c;
  local_ec[0] = RAX;
  local_ec[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_ec[0] = ST6;
  local_ec[1] = 0x14;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)_skiwi_sprintf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  local_e0._M_dataplus._M_p._0_4_ = 4;
  local_ec[0] = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x40;
  local_ec[0] = R10;
  local_ec[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_e0._M_dataplus._M_p._0_4_ = 0x4a;
  local_ec[0] = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x4a;
  local_ec[0] = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  allocate_buffer_as_string(code);
  local_e0._M_dataplus._M_p._0_4_ = 0x2c;
  local_ec[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  if (ops->safe_primitives == true) {
    error_label(code,&local_c0,re_num2str_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_num2str(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string flonum = label_to_string(label++);
  std::string cont = label_to_string(label++);
  std::string oct = label_to_string(label++);
  std::string hex = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JNE, flonum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 16);
  code.add(asmcode::JES, oct);
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 32);
  code.add(asmcode::JES, hex);
  code.add(asmcode::MOV, asmcode::R15, DCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, oct);
  code.add(asmcode::MOV, asmcode::R15, OCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, hex);
  code.add(asmcode::MOV, asmcode::R15, XCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, flonum);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::MOV, asmcode::R15, GCVT);

  /*
  Windows:
  rcx
  rdx
  r8

  Linux:
  rdi
  rsi
  rdx
  */
#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::RCX);
  code.add(asmcode::MOVQ, asmcode::XMM2, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RCX, BUFFER);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);

  code.add(asmcode::MOVQ, asmcode::XMM0, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RDI, BUFFER);
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf_floating);
#else
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf_floating);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
#else
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif

  allocate_buffer_as_string(code);

  code.add(asmcode::JMP, CONTINUE);


  code.add(asmcode::LABEL, cont); // rcx contains number, r15 contains format

  /*
  Windows:
  rcx
  rdx
  r8

  Linux:
  rdi
  rsi
  rdx
  */
#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RCX, BUFFER);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);

  code.add(asmcode::MOV, asmcode::RDX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RDI, BUFFER);
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
#else
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif

  allocate_buffer_as_string(code);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_num2str_contract_violation);
    }
  }